

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<4>::MultiplyByFiveToTheNth
          (BigUnsigned<4> *this,int n)

{
  uint32_t *puVar1;
  
  puVar1 = (uint32_t *)(kFiveToNth + (ulong)(uint)n * 4);
  for (; 0xc < n; n = n + -0xd) {
    MultiplyBy(this,0x48c27395);
    puVar1 = puVar1 + -0xd;
  }
  if (0 < n) {
    MultiplyBy(this,*puVar1);
    return;
  }
  return;
}

Assistant:

void MultiplyByFiveToTheNth(int n) {
    while (n >= kMaxSmallPowerOfFive) {
      MultiplyBy(kFiveToNth[kMaxSmallPowerOfFive]);
      n -= kMaxSmallPowerOfFive;
    }
    if (n > 0) {
      MultiplyBy(kFiveToNth[n]);
    }
  }